

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

void GetFileAndPassword(char *nextarg,char **file,char **password)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  char *pcVar8;
  char *__s;
  
  sVar3 = strlen(nextarg);
  if (sVar3 == 0) {
LAB_00112e57:
    pcVar4 = (char *)0x0;
  }
  else {
    iVar2 = curl_strnequal(nextarg,"pkcs11:",7);
    if ((iVar2 == 0) && (pcVar4 = strpbrk(nextarg,":\\"), pcVar4 != (char *)0x0)) {
      pcVar4 = (char *)malloc(sVar3 + 1);
      if (pcVar4 != (char *)0x0) {
        pcVar7 = pcVar4;
        if (*nextarg == '\0') {
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = (char *)0x0;
          __s = nextarg;
          do {
            sVar3 = strcspn(__s,":\\");
            strncpy(pcVar7,__s,sVar3);
            pcVar1 = __s + sVar3;
            pcVar7 = pcVar7 + sVar3;
            cVar6 = __s[sVar3];
            if (cVar6 == '\\') {
              cVar6 = pcVar1[1];
              pcVar8 = pcVar7 + 1;
              if (cVar6 == ':') {
                *pcVar7 = ':';
              }
              else if (cVar6 == '\\') {
                *pcVar7 = '\\';
              }
              else {
                if (cVar6 == '\0') {
                  *pcVar7 = '\\';
                  pcVar5 = (char *)0x0;
                  pcVar7 = pcVar8;
                  break;
                }
                *pcVar7 = '\\';
                pcVar7[1] = cVar6;
                pcVar8 = pcVar7 + 2;
              }
              cVar6 = pcVar1[2];
              __s = pcVar1 + 2;
              pcVar7 = pcVar8;
            }
            else {
              __s = pcVar1;
              if (cVar6 == ':') {
                if (pcVar1[1] == '\0') {
                  pcVar5 = (char *)0x0;
                }
                else {
                  pcVar5 = strdup(pcVar1 + 1);
                }
                break;
              }
            }
          } while (cVar6 != '\0');
        }
        *pcVar7 = '\0';
        goto LAB_00112e5c;
      }
      goto LAB_00112e57;
    }
    pcVar4 = strdup(nextarg);
  }
  pcVar5 = (char *)0x0;
LAB_00112e5c:
  free(*file);
  *file = pcVar4;
  if (pcVar5 != (char *)0x0) {
    free(*password);
    *password = pcVar5;
  }
  cleanarg(nextarg);
  return;
}

Assistant:

static void
GetFileAndPassword(char *nextarg, char **file, char **password)
{
  char *certname, *passphrase;
  parse_cert_parameter(nextarg, &certname, &passphrase);
  Curl_safefree(*file);
  *file = certname;
  if(passphrase) {
    Curl_safefree(*password);
    *password = passphrase;
  }
  cleanarg(nextarg);
}